

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,float,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  float fVar2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_2>_> *pVVar5;
  pointer pcVar6;
  Variable<float> *pVVar7;
  _func_int **pp_Var8;
  PrecisionCase *pPVar9;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar10;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pIVar11;
  undefined8 uVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  char *pcVar16;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  long lVar20;
  IVal *pIVar21;
  IVal *pIVar22;
  TestError *this_00;
  uint uVar23;
  TestLog *pTVar24;
  Vector<float,_2> *pVVar25;
  size_t size;
  ulong uVar26;
  IVal in2;
  FuncSet funcs;
  IVal reference1;
  ostringstream os;
  IVal in3;
  Environment env;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_4f8 [8];
  PrecisionCase *local_4f0;
  string local_4e8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4c8;
  undefined1 local_4c0 [24];
  _Rb_tree_node_base *local_4a8;
  _Rb_tree_node_base *local_4a0;
  double local_498;
  FloatFormat *local_490;
  IVal local_481;
  pointer local_480;
  Statement *local_478;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_470;
  undefined1 local_468 [8];
  undefined1 auStack_460 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  double local_448;
  Data DStack_440;
  undefined4 local_430;
  ios_base local_3f8 [8];
  ios_base local_3f0 [272];
  string local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2c0;
  size_t local_290;
  ulong local_288;
  ResultCollector *local_280;
  FloatFormat local_278;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [32];
  double local_188;
  double dStack_180;
  ios_base local_138 [264];
  
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  size = (long)pVVar4 - (long)pVVar3 >> 3;
  local_4c8 = variables;
  local_478 = stmt;
  local_470 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_250,size);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_278.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_278.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_278.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_278.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_278.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_278.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_278.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_278.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_278._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c0._M_impl.super__Rb_tree_header._M_header;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"Statement: ",0xb);
  (*local_478->_vptr_Statement[2])(local_478,(ostringstream *)auStack_460);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4f0 = this;
  local_480 = pVVar3;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_460);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_4c0 + 8);
  local_4c0._8_4_ = _S_red;
  local_4c0._16_8_ = (_Base_ptr)0x0;
  local_498 = 0.0;
  local_4a8 = p_Var1;
  local_4a0 = p_Var1;
  (*local_478->_vptr_Statement[4])(local_478,local_4c0);
  if (local_4a8 != p_Var1) {
    p_Var15 = local_4a8;
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),local_1a8);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var1);
  }
  pPVar9 = local_4f0;
  if (local_498 != 0.0) {
    local_468 = (undefined1  [8])((local_4f0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_460,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_460,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_460);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468,"precision ",10);
  pcVar16 = glu::getPrecisionName((pPVar9->m_ctx).precision);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)(auStack_4f8 + (long)((TestLog *)((long)local_468 + -0x18))->m_log) + 0x90)
    ;
  }
  else {
    sVar17 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468,pcVar16,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
  std::ios_base::~ios_base(local_3f8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_4f0->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_4f0->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_4f0->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar24 = (TestLog *)(plVar18 + 2);
    if ((TestLog *)*plVar18 == pTVar24) {
      local_458._M_allocated_capacity = (size_type)pTVar24->m_log;
      local_458._8_8_ = plVar18[3];
      local_468 = (undefined1  [8])(auStack_460 + 8);
    }
    else {
      local_458._M_allocated_capacity = (size_type)pTVar24->m_log;
      local_468 = (undefined1  [8])*plVar18;
    }
    auStack_460 = (undefined1  [8])plVar18[1];
    *plVar18 = (long)pTVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_468);
    if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
      operator_delete((void *)local_468,(ulong)(local_458._M_allocated_capacity + 1));
    }
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),3);
  makeSymbol<float>((Symbol *)local_468,local_4f0,
                    (local_4c8->in2).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar12 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x70),(string *)local_468);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x70))->varType,(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
    operator_delete((void *)local_468,(ulong)(local_458._M_allocated_capacity + 1));
  }
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_468,local_4f0,
             (local_4c8->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar12 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_468);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x38))->varType,(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
    operator_delete((void *)local_468,(ulong)(local_458._M_allocated_capacity + 1));
  }
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_468,local_4f0,
             (local_4c8->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar12 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_468);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
    operator_delete((void *)local_468,(ulong)(local_458._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_468,local_4f0,
             (local_4c8->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar12 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_468);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
    operator_delete((void *)local_468,(ulong)(local_458._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
  (*local_478->_vptr_Statement[2])(local_478,local_468);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
  std::ios_base::~ios_base(local_3f8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar9 = local_4f0;
  pSVar19 = ShaderExecUtil::createExecutor
                      ((local_4f0->m_ctx).renderContext,(local_4f0->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_468 = (undefined1  [8])
              (local_470->in0).
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  auStack_460 = (undefined1  [8])
                (local_470->in1).
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_458._M_allocated_capacity =
       (size_type)
       (local_470->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_458._8_8_ =
       (local_470->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,size & 0xffffffff,local_468);
  local_490 = &(pPVar9->m_ctx).floatFormat;
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  pVVar10 = local_4c8;
  lVar20 = 0x10;
  do {
    *(undefined1 *)((long)&local_478 + lVar20) = 0;
    *(undefined8 *)((long)&local_470 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_468 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x40);
  lVar20 = 0x10;
  do {
    *(undefined1 *)((long)&local_478 + lVar20) = 0;
    *(undefined8 *)((long)&local_470 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_468 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 == 0x28);
  lVar20 = 0x10;
  do {
    local_1b8._M_local_buf[lVar20] = '\0';
    *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x40);
  lVar20 = 0x10;
  do {
    local_1b8._M_local_buf[lVar20] = '\0';
    *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 == 0x28);
  local_4e8._M_dataplus._M_p = local_4e8._M_dataplus._M_p & 0xffffffffffffff00;
  local_4e8._M_string_length = 0x7ff0000000000000;
  local_4e8.field_2._M_allocated_capacity = 0xfff0000000000000;
  lVar20 = 0x10;
  do {
    local_4e8.field_2._M_local_buf[lVar20 + 8] = '\0';
    *(undefined8 *)((long)&local_4c8 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_4c0 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x40);
  lVar20 = 0x10;
  do {
    local_4e8.field_2._M_local_buf[lVar20 + 8] = '\0';
    *(undefined8 *)((long)&local_4c8 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_4c0 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 == 0x28);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2c0,
             (local_4c8->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_468);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2c0,
             (pVVar10->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<float>
            ((Environment *)&local_2c0,
             (pVVar10->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)&local_4e8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c0,
             (pVVar10->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_2e0);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2c0,
             (pVVar10->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_4c0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c0,
             (pVVar10->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_481);
  local_290 = size;
  if (pVVar4 == local_480) {
    local_480 = (pointer)0x0;
  }
  else {
    local_280 = &local_4f0->m_status;
    local_288 = size + (size == 0);
    uVar26 = 0;
    local_480 = (pointer)0x0;
    do {
      lVar20 = 0x10;
      do {
        local_1b8._M_local_buf[lVar20] = '\0';
        *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x40);
      lVar20 = 0x10;
      do {
        local_1b8._M_local_buf[lVar20] = '\0';
        *(undefined8 *)(local_1a8 + lVar20 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 == 0x28);
      if ((uVar26 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_4f0->super_TestCase).super_TestNode.m_testCtx);
      }
      pIVar11 = local_470;
      local_4e8._M_dataplus._M_p =
           *(pointer *)
            (local_470->in0).
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar26].m_data;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_4c0,local_490,(Vector<float,_2> *)&local_4e8);
      pVVar10 = local_4c8;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_468,local_490,(IVal *)local_4c0);
      pIVar21 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2c0,
                           (pVVar10->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar21->m_data[1].m_lo = local_448;
      pIVar21->m_data[1].m_hi = (double)CONCAT44(DStack_440.basic.precision,DStack_440.basic.type);
      pIVar21->m_data[0].m_hi = (double)local_458._M_allocated_capacity;
      *(undefined8 *)(pIVar21->m_data + 1) = local_458._8_8_;
      pIVar21->m_data[0].m_hasNaN = local_468;
      pIVar21->m_data[0].m_lo = (double)auStack_460;
      local_4e8._M_dataplus._M_p =
           *(pointer *)
            (pIVar11->in1).
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar26].m_data;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_4c0,local_490,(Vector<float,_2> *)&local_4e8);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_468,local_490,(IVal *)local_4c0);
      pIVar21 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2c0,
                           (pVVar10->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar21->m_data[1].m_lo = local_448;
      pIVar21->m_data[1].m_hi = (double)CONCAT44(DStack_440.basic.precision,DStack_440.basic.type);
      pIVar21->m_data[0].m_hi = (double)local_458._M_allocated_capacity;
      *(undefined8 *)(pIVar21->m_data + 1) = local_458._8_8_;
      pIVar21->m_data[0].m_hasNaN = local_468;
      pIVar21->m_data[0].m_lo = (double)auStack_460;
      fVar2 = (pIVar11->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar26];
      pp_Var8 = (_func_int **)(double)fVar2;
      bVar13 = NAN(fVar2);
      local_468[0] = bVar13;
      auStack_460 = (undefined1  [8])(_func_int **)0x7ff0000000000000;
      if (!bVar13) {
        auStack_460 = (undefined1  [8])pp_Var8;
      }
      local_458._M_allocated_capacity = (size_type)(_func_int **)0xfff0000000000000;
      if (!bVar13) {
        local_458._M_allocated_capacity = (size_type)pp_Var8;
      }
      tcu::FloatFormat::roundOut((Interval *)&local_4e8,local_490,(Interval *)local_468,false);
      tcu::FloatFormat::convert((Interval *)local_4c0,local_490,(Interval *)&local_4e8);
      pIVar22 = Environment::lookup<float>
                          ((Environment *)&local_2c0,
                           (pVVar10->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pIVar22->m_hi = (double)local_4c0._16_8_;
      *(undefined8 *)pIVar22 = local_4c0._0_8_;
      pIVar22->m_lo = (double)CONCAT44(local_4c0._12_4_,local_4c0._8_4_);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2c0,
                 (pVVar10->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      DStack_440.basic.type = (local_4f0->m_ctx).precision;
      local_448 = local_490->m_maxValue;
      local_468 = *(undefined1 (*) [8])local_490;
      auStack_460 = *(undefined1 (*) [8])&local_490->m_fractionBits;
      local_458._M_allocated_capacity = *(undefined8 *)&local_490->m_hasInf;
      local_458._8_8_ = *(undefined8 *)&local_490->m_exactPrecision;
      local_430 = 0;
      DStack_440._8_8_ = &local_2c0;
      (*local_478->_vptr_Statement[3])(local_478,local_468);
      pIVar21 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2c0,
                           (pVVar10->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_468,&local_278,pIVar21);
      dStack_180 = (double)CONCAT44(DStack_440.basic.precision,DStack_440.basic.type);
      local_188 = local_448;
      local_1a8._16_8_ = local_458._M_allocated_capacity;
      local_1a8._24_8_ = local_458._8_8_;
      local_1a8._0_8_ = local_468;
      local_1a8._8_8_ = auStack_460;
      bVar13 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                         ((IVal *)local_1a8,
                          local_250.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar26);
      local_468 = (undefined1  [8])(auStack_460 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_280,bVar13,(string *)local_468);
      if (local_468 != (undefined1  [8])(auStack_460 + 8)) {
        operator_delete((void *)local_468,local_458._M_allocated_capacity + 1);
      }
      uVar23 = (int)local_480 + ((byte)~bVar13 & 1);
      local_480 = (pointer)(ulong)uVar23;
      if ((int)uVar23 < 0x65 && !bVar13) {
        local_468 = (undefined1  [8])((local_4f0->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
        pcVar16 = "Failed";
        if (bVar13) {
          pcVar16 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,pcVar16,6);
        pIVar11 = local_470;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\t",1);
        pVVar5 = (local_4c8->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pVVar25 = (Vector<float,_2> *)(local_4c0 + 0x10);
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_4c0._0_8_ = pVVar25;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4c0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,(char *)local_4c0._0_8_,
                   CONCAT44(local_4c0._12_4_,local_4c0._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," = ",3);
        valueToString<tcu::Vector<float,2>>
                  (&local_4e8,(BuiltinPrecisionTests *)&local_278,
                   (FloatFormat *)
                   ((pIVar11->in0).
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar26),pVVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_2> *)local_4c0._0_8_ != (Vector<float,_2> *)(local_4c0 + 0x10)) {
          operator_delete((void *)local_4c0._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_4c0._16_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\t",1);
        pVVar5 = (local_4c8->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pVVar25 = (Vector<float,_2> *)(local_4c0 + 0x10);
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_4c0._0_8_ = pVVar25;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4c0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,(char *)local_4c0._0_8_,
                   CONCAT44(local_4c0._12_4_,local_4c0._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," = ",3);
        valueToString<tcu::Vector<float,2>>
                  (&local_4e8,(BuiltinPrecisionTests *)&local_278,
                   (FloatFormat *)
                   ((pIVar11->in1).
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar26),pVVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_2> *)local_4c0._0_8_ != (Vector<float,_2> *)(local_4c0 + 0x10)) {
          operator_delete((void *)local_4c0._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_4c0._16_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\t",1);
        pVVar7 = (local_4c8->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_4c0._0_8_ = local_4c0 + 0x10;
        pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4c0,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,(char *)local_4c0._0_8_,
                   CONCAT44(local_4c0._12_4_,local_4c0._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," = ",3);
        valueToString<float>
                  (&local_4e8,&local_278,
                   (pIVar11->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
          operator_delete((void *)local_4c0._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_4c0._16_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\t",1);
        pVVar5 = (local_4c8->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pIVar21 = (IVal *)(local_4c0 + 0x10);
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_4c0._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4c0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,(char *)local_4c0._0_8_,
                   CONCAT44(local_4c0._12_4_,local_4c0._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," = ",3);
        valueToString<tcu::Vector<float,2>>
                  (&local_4e8,(BuiltinPrecisionTests *)&local_278,
                   (FloatFormat *)
                   (local_250.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar26),(Vector<float,_2> *)pIVar21)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_2e0,(BuiltinPrecisionTests *)&local_278,(FloatFormat *)local_1a8,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_460,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_4c0._0_8_ != (IVal *)(local_4c0 + 0x10)) {
          operator_delete((void *)local_4c0._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_4c0._16_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_460);
        std::ios_base::~ios_base(local_3f0);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != local_288);
  }
  pPVar9 = local_4f0;
  iVar14 = (int)local_480;
  if (100 < iVar14) {
    local_468 = (undefined1  [8])((local_4f0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"(Skipped ",9);
    std::ostream::operator<<((ostringstream *)auStack_460,iVar14 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_460);
    std::ios_base::~ios_base(local_3f0);
  }
  if (iVar14 == 0) {
    local_468 = (undefined1  [8])((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_468 = (undefined1  [8])((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_460);
    std::ostream::operator<<((ostringstream *)auStack_460,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_460," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_460);
  std::ios_base::~ios_base(local_3f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}